

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::doVisitSelect(Graph *this,Select *curr)

{
  bool bVar1;
  Node *pNVar2;
  Graph *this_00;
  Graph *this_01;
  Graph *this_02;
  Node *ret;
  Node *condition;
  Node *ifFalse;
  Node *ifTrue;
  Select *curr_local;
  Graph *this_local;
  
  pNVar2 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                     ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->ifTrue);
  this_00 = (Graph *)expandFromI1(this,pNVar2,(Expression *)curr);
  bVar1 = Node::isBad((Node *)this_00);
  this_local = this_00;
  if (!bVar1) {
    pNVar2 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                       ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->ifFalse
                       );
    this_01 = (Graph *)expandFromI1(this,pNVar2,(Expression *)curr);
    bVar1 = Node::isBad((Node *)this_01);
    this_local = this_01;
    if (!bVar1) {
      pNVar2 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                         ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
                          curr->condition);
      this_local = (Graph *)ensureI1(this,pNVar2,(Expression *)curr);
      bVar1 = Node::isBad((Node *)this_local);
      if (!bVar1) {
        pNVar2 = Node::makeExpr((Expression *)curr,(Expression *)curr);
        this_02 = (Graph *)addNode(this,pNVar2);
        Node::addValue((Node *)this_02,(Node *)this_local);
        Node::addValue((Node *)this_02,(Node *)this_00);
        Node::addValue((Node *)this_02,(Node *)this_01);
        this_local = this_02;
      }
    }
  }
  return &this_local->bad;
}

Assistant:

Node* doVisitSelect(Select* curr) {
    auto* ifTrue = expandFromI1(visit(curr->ifTrue), curr);
    if (ifTrue->isBad()) {
      return ifTrue;
    }
    auto* ifFalse = expandFromI1(visit(curr->ifFalse), curr);
    if (ifFalse->isBad()) {
      return ifFalse;
    }
    auto* condition = ensureI1(visit(curr->condition), curr);
    if (condition->isBad()) {
      return condition;
    }
    // Great, we are supported!
    auto* ret = addNode(Node::makeExpr(curr, curr));
    ret->addValue(condition);
    ret->addValue(ifTrue);
    ret->addValue(ifFalse);
    return ret;
  }